

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O2

Ref<embree::XML> __thiscall
embree::parseXML(embree *this,Ref<embree::Stream<int>_> *chars,string *id,bool hasHeader,
                bool hasTail)

{
  bool bVar1;
  TokenStream *this_00;
  Token *pTVar2;
  runtime_error *this_01;
  Token TStack_e8;
  Ref<embree::Stream<embree::Token>_> cin;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  symbols;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  symbols.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  symbols.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  symbols.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&TStack_e8,"<!--",(allocator *)&local_78);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&symbols,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&TStack_e8);
  std::__cxx11::string::~string((string *)&TStack_e8);
  std::__cxx11::string::string((string *)&TStack_e8,"-->",(allocator *)&local_78);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&symbols,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&TStack_e8);
  std::__cxx11::string::~string((string *)&TStack_e8);
  std::__cxx11::string::string((string *)&TStack_e8,"<?",(allocator *)&local_78);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&symbols,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&TStack_e8);
  std::__cxx11::string::~string((string *)&TStack_e8);
  std::__cxx11::string::string((string *)&TStack_e8,"?>",(allocator *)&local_78);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&symbols,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&TStack_e8);
  std::__cxx11::string::~string((string *)&TStack_e8);
  std::__cxx11::string::string((string *)&TStack_e8,"</",(allocator *)&local_78);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&symbols,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&TStack_e8);
  std::__cxx11::string::~string((string *)&TStack_e8);
  std::__cxx11::string::string((string *)&TStack_e8,"/>",(allocator *)&local_78);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&symbols,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&TStack_e8);
  std::__cxx11::string::~string((string *)&TStack_e8);
  std::__cxx11::string::string((string *)&TStack_e8,"<",(allocator *)&local_78);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&symbols,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&TStack_e8);
  std::__cxx11::string::~string((string *)&TStack_e8);
  std::__cxx11::string::string((string *)&TStack_e8,">",(allocator *)&local_78);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&symbols,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&TStack_e8);
  std::__cxx11::string::~string((string *)&TStack_e8);
  std::__cxx11::string::string((string *)&TStack_e8,"=",(allocator *)&local_78);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&symbols,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&TStack_e8);
  std::__cxx11::string::~string((string *)&TStack_e8);
  this_00 = (TokenStream *)::operator_new(0x360);
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 TokenStream::alpha_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 TokenStream::ALPHA_abi_cxx11_);
  std::operator+(&local_78,&local_50,"_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&TStack_e8,
                 &local_78,id);
  TokenStream::TokenStream
            (this_00,chars,(string *)&TStack_e8,(string *)TokenStream::separators_abi_cxx11_,
             &symbols);
  cin.ptr = (Stream<embree::Token> *)this_00;
  (*(this_00->super_Stream<embree::Token>).super_RefCount._vptr_RefCount[2])(this_00);
  std::__cxx11::string::~string((string *)&TStack_e8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_50);
  if (hasHeader) {
    parseHeader((embree *)&local_58,&cin);
    if (local_58 != (long *)0x0) {
      (**(code **)(*local_58 + 0x18))();
    }
  }
  parseComments(&cin);
  parseXML(this,&cin,0);
  parseComments(&cin);
  if (!hasTail) {
    pTVar2 = Stream<embree::Token>::peek((Stream<embree::Token> *)this_00);
    Token::Eof();
    bVar1 = operator!=(pTVar2,&TStack_e8);
    Token::~Token(&TStack_e8);
    if (bVar1) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      pTVar2 = Stream<embree::Token>::peek((Stream<embree::Token> *)this_00);
      ParseLocation::str_abi_cxx11_(&local_78,&pTVar2->loc);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&TStack_e8
                     ,&local_78,": end of file expected");
      std::runtime_error::runtime_error(this_01,(string *)&TStack_e8);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  (*(this_00->super_Stream<embree::Token>).super_RefCount._vptr_RefCount[3])(this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&symbols);
  return (Ref<embree::XML>)(XML *)this;
}

Assistant:

Ref<XML> parseXML(Ref<Stream<int> > chars, std::string id, bool hasHeader = true, bool hasTail = false)
  {
    /* create lexer for XML file */
    std::vector<std::string> symbols;
    symbols.push_back("<!--");
    symbols.push_back("-->");
    symbols.push_back("<?");
    symbols.push_back("?>");
    symbols.push_back("</");
    symbols.push_back("/>");
    symbols.push_back("<");
    symbols.push_back(">");
    symbols.push_back("=");
    Ref<Stream<Token> > cin = new TokenStream(chars,TokenStream::alpha + TokenStream::ALPHA + "_" + id, TokenStream::separators, symbols);

    if (hasHeader) parseHeader(cin);
    parseComments(cin);
    Ref<XML> xml = parseXML(cin,0);
    parseComments(cin);

    if (!hasTail)
      if (cin->peek() != Token::Eof()) THROW_RUNTIME_ERROR(cin->peek().Location().str()+": end of file expected");

    return xml;
  }